

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<false,_false,_false>::insert_branch_(DaTrie<false,_false,_false> *this,Query *query)

{
  pointer pBVar1;
  uint32_t uVar2;
  byte bVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  Edge local_138;
  
  uVar6 = (ulong)(SUB84((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                        super__Vector_impl_data._M_start[query->node_pos_],0) & 0x7fffffff);
  pcVar4 = query->key_;
  uVar7 = query->pos_;
  bVar3 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6];
  while( true ) {
    if (pcVar4[uVar7] != bVar3) break;
    append_edge_(this,query);
    this->tail_emps_ = this->tail_emps_ + 1;
    uVar6 = (ulong)((int)uVar6 + 1);
    pcVar4 = query->key_;
    uVar7 = query->pos_;
    bVar3 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6];
  }
  uVar5 = (int)uVar6 + 1;
  this->tail_emps_ = this->tail_emps_ + 1;
  memset(&local_138,0,0x100);
  local_138.labels_[1] = pcVar4[uVar7];
  local_138.size_ = 2;
  local_138.labels_[0] = bVar3;
  uVar2 = xcheck_(this,&local_138,&this->blocks_);
  *(uint32_t *)
   ((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
    super__Vector_impl_data._M_start + query->node_pos_) = uVar2 & 0x7fffffff;
  uVar7 = uVar2 ^ bVar3;
  fix_(this,uVar7,&this->blocks_);
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1[uVar7] =
       (Bc)((ulong)pBVar1[uVar7] & 0x80000000ffffffff |
           (ulong)(query->node_pos_ & 0x7fffffff) << 0x20);
  if (bVar3 == 0) {
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar1[uVar7] =
         (Bc)((ulong)pBVar1[uVar7] & 0xffffffff00000000 |
              (ulong)*(uint *)((this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl
                               .super__Vector_impl_data._M_start + uVar5) | 0x80000000);
    this->tail_emps_ = this->tail_emps_ + 4;
  }
  else {
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar1[uVar7] = (Bc)((ulong)(uVar5 | 0x80000000) | (ulong)pBVar1[uVar7] & 0xffffffff00000000);
  }
  insert_edge_(this,query);
  return;
}

Assistant:

void insert_branch_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_leaf());

    auto tail_pos = bc_[query.node_pos()].value();

    while (*query.key() == tail_[tail_pos]) {
      append_edge_(query);
      ++tail_pos;
      ++tail_emps_;
    }

    auto branch = static_cast<uint8_t>(tail_[tail_pos++]);
    ++tail_emps_;

    Edge edge;
    edge.push(branch);
    edge.push(query.label());

    auto base = xcheck_(edge, blocks_);
    bc_[query.node_pos()].set_base(base);

    auto child_pos = base ^branch;
    fix_(child_pos, blocks_);

    bc_[child_pos].set_check(query.node_pos());
    if (branch != '\0') {
      bc_[child_pos].set_value(tail_pos);
    } else {
      uint32_t value = 0;
      std::memcpy(&value, tail_.data() + tail_pos, sizeof(uint32_t));
      bc_[child_pos].set_value(value);
      tail_emps_ += sizeof(uint32_t);
    }

    if (WithNLM) {
      node_links_[query.node_pos()].child = branch;
      node_links_[child_pos].sib = branch;
    }
    insert_edge_(query);
  }